

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_add_int(tnt_stream *s,int64_t value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  char *pcVar4;
  ssize_t sVar5;
  char local_1a [8];
  char data [10];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  if (value < 0) {
    pcVar4 = mp_encode_int(local_1a,value);
  }
  else {
    pcVar4 = mp_encode_uint(local_1a,value);
  }
  sVar5 = (*s->write)(s,local_1a,(long)pcVar4 - (long)local_1a);
  return sVar5;
}

Assistant:

ssize_t
tnt_object_add_int (struct tnt_stream *s, int64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	if (value < 0)
		end = mp_encode_int(data, value);
	else
		end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}